

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

int Search::choose_policy(search_private *priv,bool advance_prng)

{
  int iVar1;
  search_private *priv_00;
  undefined8 uVar2;
  byte in_SIL;
  long in_RDI;
  stringstream __msg;
  RollMethod method;
  bool in_stack_fffffffffffffe15;
  bool in_stack_fffffffffffffe16;
  bool in_stack_fffffffffffffe17;
  bool allow_current;
  uint local_1e0;
  uint in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 uVar3;
  vw_exception *in_stack_fffffffffffffe30;
  stringstream local_1a0 [16];
  ostream local_190;
  uint local_18;
  byte local_11;
  long local_10;
  int local_4;
  
  local_11 = in_SIL & 1;
  if (*(int *)(in_RDI + 0x6c) == 1) {
    local_1e0 = 0;
  }
  else if (*(int *)(in_RDI + 0x6c) == 3) {
    in_stack_fffffffffffffe24 = *(uint *)(in_RDI + 0x298);
    local_1e0 = in_stack_fffffffffffffe24;
  }
  else if (*(int *)(in_RDI + 0x6c) == 2) {
    in_stack_fffffffffffffe24 = *(uint *)(in_RDI + 0x29c);
    local_1e0 = in_stack_fffffffffffffe24;
  }
  else {
    local_1e0 = 4;
    in_stack_fffffffffffffe24 = local_1e0;
  }
  priv_00 = (search_private *)(ulong)local_1e0;
  local_18 = local_1e0;
  switch(priv_00) {
  case (search_private *)0x0:
    allow_current = true;
    if ((*(byte *)(in_RDI + 0x2a5) & 1) == 0) {
      allow_current = *(int *)(in_RDI + 0x6c) == 1;
    }
    local_4 = random_policy(priv_00,allow_current,in_stack_fffffffffffffe16,
                            in_stack_fffffffffffffe15);
    break;
  case (search_private *)0x1:
    local_4 = -1;
    break;
  case (search_private *)0x2:
    local_4 = random_policy(priv_00,in_stack_fffffffffffffe17,in_stack_fffffffffffffe16,
                            in_stack_fffffffffffffe15);
    break;
  case (search_private *)0x3:
    local_10 = in_RDI;
    if (*(int *)(in_RDI + 0x78) == -2) {
      iVar1 = random_policy(priv_00,in_stack_fffffffffffffe17,in_stack_fffffffffffffe16,
                            in_stack_fffffffffffffe15);
      *(int *)(local_10 + 0x78) = iVar1;
    }
    local_4 = *(int *)(local_10 + 0x78);
    break;
  case (search_private *)0x4:
  default:
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(&local_190,"internal error (bug): trying to rollin or rollout with NO_ROLLOUT");
    uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffe2c);
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe30,(char *)CONCAT44(uVar3,local_1e0),in_stack_fffffffffffffe24
               ,(string *)priv_00);
    __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return local_4;
}

Assistant:

int choose_policy(search_private& priv, bool advance_prng = true)
{
  RollMethod method = (priv.state == INIT_TEST) ? POLICY
                                                : (priv.state == LEARN)
          ? priv.rollout_method
          : (priv.state == INIT_TRAIN) ? priv.rollin_method : NO_ROLLOUT;  // this should never happen
  switch (method)
  {
    case POLICY:
      return random_policy(priv, priv.allow_current_policy || (priv.state == INIT_TEST), false, advance_prng);

    case ORACLE:
      return -1;

    case MIX_PER_STATE:
      return random_policy(priv, priv.allow_current_policy, true, advance_prng);

    case MIX_PER_ROLL:
      if (priv.mix_per_roll_policy == -2)  // then we have to choose one!
        priv.mix_per_roll_policy = random_policy(priv, priv.allow_current_policy, true, advance_prng);
      return priv.mix_per_roll_policy;

    case NO_ROLLOUT:
    default:
      THROW("internal error (bug): trying to rollin or rollout with NO_ROLLOUT");
  }
}